

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O1

void DecodeAperiodicity(double **coded_aperiodicity,int f0_length,int fs,int fft_size,
                       double **aperiodicity)

{
  double *pdVar1;
  uint uVar2;
  double *pdVar3;
  double *x;
  double *y;
  ulong uVar4;
  ulong uVar5;
  uint xi_length;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (0 < f0_length) {
    uVar4 = 0;
    do {
      if (-2 < fft_size) {
        pdVar3 = aperiodicity[uVar4];
        uVar5 = 0;
        do {
          pdVar3[uVar5] = 0.999999999999;
          uVar5 = uVar5 + 1;
        } while (fft_size / 2 + 1 != uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)f0_length);
  }
  dVar9 = (double)fs * 0.5;
  dVar7 = dVar9 + -3000.0;
  dVar8 = 15000.0;
  if (dVar7 <= 15000.0) {
    dVar8 = dVar7;
  }
  uVar2 = (uint)(dVar8 / 3000.0);
  xi_length = fft_size / 2 + 1;
  uVar4 = (long)(fft_size / 2) * 8 + 8;
  if (fft_size < -3) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar4);
  if (-2 < fft_size) {
    uVar4 = 0;
    do {
      pdVar3[uVar4] = (double)(int)uVar4 * ((double)fs / (double)fft_size);
      uVar4 = uVar4 + 1;
    } while (xi_length != uVar4);
  }
  lVar6 = (long)(int)uVar2;
  uVar4 = lVar6 * 8 + 0x10;
  if ((int)uVar2 < -2) {
    uVar4 = 0xffffffffffffffff;
  }
  x = (double *)operator_new__(uVar4);
  if (-1 < (int)uVar2) {
    uVar5 = 0;
    do {
      x[uVar5] = (double)(int)uVar5 * 3000.0;
      uVar5 = uVar5 + 1;
    } while (uVar2 + 1 != uVar5);
  }
  x[lVar6 + 1] = dVar9;
  y = (double *)operator_new__(uVar4);
  *y = -60.0;
  y[lVar6 + 1] = -1e-12;
  if (0 < f0_length) {
    uVar4 = 0;
    do {
      if ((int)uVar2 < 1) {
        dVar8 = 0.0;
      }
      else {
        pdVar1 = coded_aperiodicity[uVar4];
        dVar8 = 0.0;
        uVar5 = 0;
        do {
          dVar8 = dVar8 + pdVar1[uVar5];
          y[uVar5 + 1] = pdVar1[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      if (dVar8 / (double)(int)uVar2 <= -0.5) {
        pdVar1 = aperiodicity[uVar4];
        interp1(x,y,uVar2 + 2,pdVar3,xi_length,pdVar1);
        if (-2 < fft_size) {
          uVar5 = 0;
          do {
            dVar8 = pow(10.0,pdVar1[uVar5] / 20.0);
            pdVar1[uVar5] = dVar8;
            uVar5 = uVar5 + 1;
          } while (xi_length != uVar5);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)f0_length);
  }
  operator_delete__(y);
  operator_delete__(x);
  operator_delete__(pdVar3);
  return;
}

Assistant:

void DecodeAperiodicity(const double * const *coded_aperiodicity,
    int f0_length, int fs, int fft_size, double **aperiodicity) {
  InitializeAperiodicity(f0_length, fft_size, aperiodicity);
  int number_of_aperiodicities = GetNumberOfAperiodicities(fs);
  double *frequency_axis = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i)
    frequency_axis[i] = static_cast<double>(fs) / fft_size * i;

  double *coarse_frequency_axis = new double[number_of_aperiodicities + 2];
  for (int i = 0; i <= number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = i * world::kFrequencyInterval;
  coarse_frequency_axis[number_of_aperiodicities + 1] = fs / 2.0;

  double *coarse_aperiodicity = new double[number_of_aperiodicities + 2];
  coarse_aperiodicity[0] = -60.0;
  coarse_aperiodicity[number_of_aperiodicities + 1] =
    -world::kMySafeGuardMinimum;

  for (int i = 0; i < f0_length; ++i) {
    if (CheckVUV(coded_aperiodicity[i], number_of_aperiodicities,
      coarse_aperiodicity) == 1) continue;
    GetAperiodicity(coarse_frequency_axis, coarse_aperiodicity,
        number_of_aperiodicities, frequency_axis, fft_size, aperiodicity[i]);
  }

  delete[] coarse_aperiodicity;
  delete[] coarse_frequency_axis;
  delete[] frequency_axis;
}